

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_mp_cond_swap(void)

{
  mp_int *x;
  mp_int *x_00;
  size_t sVar1;
  size_t i;
  ulong uVar2;
  
  x = mp_random_bits_fn(0x200,random_read);
  x_00 = mp_random_bits_fn(0x200,random_read);
  uVar2 = 0;
  while( true ) {
    sVar1 = (*looplimit)(0x10);
    if (sVar1 <= uVar2) break;
    log_start();
    mp_cond_swap(x,x_00,(uint)uVar2 & 1);
    log_end();
    uVar2 = uVar2 + 1;
  }
  mp_free(x);
  mp_free(x_00);
  return;
}

Assistant:

static void test_mp_cond_swap(void)
{
    mp_int *a = mp_random_bits(512);
    mp_int *b = mp_random_bits(512);
    for (size_t i = 0; i < looplimit(16); i++) {
        log_start();
        mp_cond_swap(a, b, i & 1);
        log_end();
    }
    mp_free(a);
    mp_free(b);
}